

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

int vkt::sr::anon_unknown_0::getNumMantissaBits(Precision precision)

{
  undefined4 local_c;
  Precision precision_local;
  
  if (precision == PRECISION_LOWP) {
    local_c = 6;
  }
  else if (precision == PRECISION_MEDIUMP) {
    local_c = 10;
  }
  else if (precision == PRECISION_HIGHP) {
    local_c = 0x17;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int getNumMantissaBits (const glu::Precision precision)
{
	switch (precision)
	{
		case glu::PRECISION_HIGHP:		return 23;
		case glu::PRECISION_MEDIUMP:	return 10;
		case glu::PRECISION_LOWP:		return 6;
		default:
			DE_ASSERT(false);
			return 0;
	}
}